

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_symbol.hpp
# Opt level: O2

numeric_type __thiscall
viennamath::rt_function_symbol<viennamath::rt_expression_interface<double>_>::unwrap
          (rt_function_symbol<viennamath::rt_expression_interface<double>_> *this)

{
  expression_not_unwrappable_exception *this_00;
  allocator<char> local_39;
  string local_38;
  
  this_00 = (expression_not_unwrappable_exception *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Cannot evaluate rt_function_symbol to a number!",&local_39);
  expression_not_unwrappable_exception::expression_not_unwrappable_exception(this_00,&local_38);
  __cxa_throw(this_00,&expression_not_unwrappable_exception::typeinfo,
              expression_not_unwrappable_exception::~expression_not_unwrappable_exception);
}

Assistant:

numeric_type unwrap() const { throw expression_not_unwrappable_exception("Cannot evaluate rt_function_symbol to a number!"); }